

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableNT.cpp
# Opt level: O3

Dims * __thiscall adios2::VariableNT::Count(Dims *__return_storage_ptr__,VariableNT *this)

{
  VariableBase *pointer;
  string local_e8;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  pointer = this->m_Variable;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to VariableNT::Count","");
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  switch(*(undefined4 *)(this->m_Variable + 0x28)) {
  case 1:
    adios2::core::Variable<signed_char>::Count();
    break;
  case 2:
    adios2::core::Variable<short>::Count();
    break;
  case 3:
    adios2::core::Variable<int>::Count();
    break;
  case 4:
    adios2::core::Variable<long>::Count();
    break;
  case 5:
    adios2::core::Variable<unsigned_char>::Count();
    break;
  case 6:
    adios2::core::Variable<unsigned_short>::Count();
    break;
  case 7:
    adios2::core::Variable<unsigned_int>::Count();
    break;
  case 8:
    adios2::core::Variable<unsigned_long>::Count();
    break;
  case 9:
    adios2::core::Variable<float>::Count();
    break;
  case 10:
    adios2::core::Variable<double>::Count();
    break;
  case 0xb:
    adios2::core::Variable<long_double>::Count();
    break;
  case 0xc:
    adios2::core::Variable<std::complex<float>>::Count();
    break;
  case 0xd:
    adios2::core::Variable<std::complex<double>>::Count();
    break;
  case 0xe:
    adios2::core::Variable<std::__cxx11::string>::Count();
    break;
  case 0xf:
    adios2::core::Variable<char>::Count();
    break;
  case 0x10:
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (__return_storage_ptr__,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(this->m_Variable + 0x88));
    break;
  default:
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"bindings::CXX11","");
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"VariableNT","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Count","");
    adios2::ToString_abi_cxx11_((DataType)&local_88);
    std::operator+(&local_68,"invalid data type ",&local_88);
    helper::Throw<std::runtime_error>(&local_a8,&local_c8,&local_e8,&local_68,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

Dims VariableNT::Count() const
{
    helper::CheckForNullptr(m_Variable, "in call to VariableNT::Count");
    auto type = m_Variable->m_Type;
#define declare_type(T)                                                                            \
    if (type == helper::GetDataType<T>())                                                          \
    {                                                                                              \
        return reinterpret_cast<core::Variable<T> *>(m_Variable)->Count();                         \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (type == DataType::Struct)
    {
        return reinterpret_cast<core::VariableStruct *>(m_Variable)->m_Count;
    }
    helper::Throw<std::runtime_error>("bindings::CXX11", "VariableNT", "Count",
                                      "invalid data type " + ToString(type));
    return Dims();
}